

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O3

void __thiscall tst_InsertProxyModel::testCommitSubclass_data(tst_InsertProxyModel *this)

{
  __atomic_base<int> _Var1;
  QTestData *pQVar2;
  QFlags<InsertProxyModel::InsertDirection> local_3c;
  QMetaTypeInterface *local_38;
  
  local_38 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var1._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
               super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var1._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var1._M_i,"baseModel");
  local_38 = &QtPrivate::QMetaTypeInterfaceWrapper<QFlags<InsertProxyModel::InsertDirection>_>::
              metaType;
  _Var1._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QFlags<InsertProxyModel::InsertDirection>_>::
               metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QFlags<InsertProxyModel::InsertDirection>_>::metaType.
      typeId._q_value.super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var1._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var1._M_i,"insertDirection");
  QTest::addColumnInternal(1,"canInsertColumns");
  pQVar2 = (QTestData *)QTest::newRow("List Row");
  local_38 = (QMetaTypeInterface *)createListModel(&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_3c.i = 1;
  pQVar2 = operator<<(pQVar2,&local_3c);
  QTestData::append((int)pQVar2,(void *)0x1);
  pQVar2 = (QTestData *)QTest::newRow("List Column");
  local_38 = (QMetaTypeInterface *)createListModel(&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_3c.i = 2;
  pQVar2 = operator<<(pQVar2,&local_3c);
  QTestData::append((int)pQVar2,(void *)0x1);
  pQVar2 = (QTestData *)QTest::newRow("List Row Column");
  local_38 = (QMetaTypeInterface *)createListModel(&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_3c.i = 3;
  pQVar2 = operator<<(pQVar2,&local_3c);
  QTestData::append((int)pQVar2,(void *)0x1);
  pQVar2 = (QTestData *)QTest::newRow("Table Row");
  local_38 = (QMetaTypeInterface *)createTableModel(&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_3c.i = 1;
  pQVar2 = operator<<(pQVar2,&local_3c);
  QTestData::append((int)pQVar2,(void *)0x1);
  pQVar2 = (QTestData *)QTest::newRow("Table Column");
  local_38 = (QMetaTypeInterface *)createTableModel(&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_3c.i = 2;
  pQVar2 = operator<<(pQVar2,&local_3c);
  QTestData::append((int)pQVar2,(void *)0x1);
  pQVar2 = (QTestData *)QTest::newRow("Table Row Column");
  local_38 = (QMetaTypeInterface *)createTableModel(&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_3c.i = 3;
  pQVar2 = operator<<(pQVar2,&local_3c);
  QTestData::append((int)pQVar2,(void *)0x1);
  pQVar2 = (QTestData *)QTest::newRow("Tree Row");
  local_38 = (QMetaTypeInterface *)createTreeModel(&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_3c.i = 1;
  pQVar2 = operator<<(pQVar2,&local_3c);
  QTestData::append((int)pQVar2,(void *)0x1);
  pQVar2 = (QTestData *)QTest::newRow("Tree Column");
  local_38 = (QMetaTypeInterface *)createTreeModel(&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_3c.i = 2;
  pQVar2 = operator<<(pQVar2,&local_3c);
  QTestData::append((int)pQVar2,(void *)0x1);
  pQVar2 = (QTestData *)QTest::newRow("Tree Row Column");
  local_38 = (QMetaTypeInterface *)createTreeModel(&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_3c.i = 3;
  pQVar2 = operator<<(pQVar2,&local_3c);
  QTestData::append((int)pQVar2,(void *)0x1);
  return;
}

Assistant:

void tst_InsertProxyModel::testCommitSubclass_data()
{
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<InsertProxyModel::InsertDirections>("insertDirection");
    QTest::addColumn<bool>("canInsertColumns");

    QTest::newRow("List Row") << createListModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertRow) << false;
    QTest::newRow("List Column") << createListModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertColumn) << false;
    QTest::newRow("List Row Column") << createListModel(this) << (InsertProxyModel::InsertRow | InsertProxyModel::InsertColumn) << false;
    QTest::newRow("Table Row") << createTableModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertRow) << true;
    QTest::newRow("Table Column") << createTableModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertColumn) << true;
    QTest::newRow("Table Row Column") << createTableModel(this) << (InsertProxyModel::InsertRow | InsertProxyModel::InsertColumn) << true;
    QTest::newRow("Tree Row") << createTreeModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertRow) << true;
    QTest::newRow("Tree Column") << createTreeModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertColumn) << true;
    QTest::newRow("Tree Row Column") << createTreeModel(this) << (InsertProxyModel::InsertRow | InsertProxyModel::InsertColumn) << true;
}